

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolInfo.cpp
# Opt level: O3

void __thiscall ClassInfo::Print(ClassInfo *this,ofstream *out)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  ostream *poVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>
  elem;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>
  local_60;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"name: ",6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  iVar2 = std::__cxx11::string::compare((char *)&this->baseClass);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"base: ",6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,(this->baseClass)._M_dataplus._M_p,
                        (this->baseClass)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"fields: {",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
  VariablesInfo::Print
            ((this->fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,out
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"} ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
  for (p_Var1 = (this->methods)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>
    ::pair(&local_60,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>
            *)(p_Var1 + 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"method: {",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
    MethodInfo::Print(local_60.second.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,out);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"} ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
    if (local_60.second.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.second.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
      operator_delete(local_60.first._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void ClassInfo::Print( std::ofstream& out )
{
	out << "\t" << "name: " << name << "\n";
	if( baseClass != "" ) {
		out << "\t" << "base: " << baseClass << "\n";
	}
	out << "\t" << "fields: {" << "\n";
	fields->Print( out );
	out << "\t" << "} " << "\n";
	for( auto elem : methods ) {
		out << "\t" << "method: {" << "\n";
		(elem.second)->Print( out );
		out << "\t" << "} " << "\n";
	}
}